

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValueUnion JVar6;
  ulong uVar7;
  JSValue this_obj;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  uint32_t len;
  JSPropertyEnum *props;
  uint local_9c;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int64_t local_88;
  JSPropertyEnum *local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSValue local_68;
  ulong local_58;
  JSPropertyEnum *local_50;
  JSValueUnion local_48;
  ulong local_40;
  JSValueUnion local_38;
  int64_t iVar5;
  
  JVar8 = JS_ToObject(ctx,*argv);
  iVar5 = JVar8.tag;
  local_98 = JVar8.u;
  this_obj.tag = 6;
  if ((int)JVar8.tag == 6) {
    uVar7 = 0;
    uVar4 = 0;
  }
  else {
    iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&local_80,&local_9c,(JSObject *)local_98.ptr,3);
    if (iVar2 == 0) {
      uVar4 = 1;
      JVar8 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      this_obj.tag = JVar8.tag;
      JVar3 = JVar8.u;
      uVar7 = (ulong)JVar3.ptr >> 0x20;
      if ((int)JVar8.tag != 6) {
        local_58 = (ulong)local_9c;
        local_90 = JVar3;
        local_88 = iVar5;
        local_40 = uVar7;
        if (local_58 != 0) {
          local_50 = local_80;
          local_38.float64 = local_98.float64;
          uVar7 = 0;
          do {
            JVar6._4_4_ = 0;
            JVar6.int32 = local_50[uVar7].atom;
            JVar8 = __JS_AtomToValue(ctx,local_50[uVar7].atom,0);
            JVar9.tag = JVar8.tag;
            JVar3 = JVar8.u;
            if ((uint)JVar8.tag == 6) {
LAB_001634ec:
              JVar8.tag = this_obj.tag;
              JVar8.u.ptr = local_90.ptr;
              uVar7 = local_40;
              iVar5 = local_88;
              goto LAB_001634fb;
            }
            local_78 = local_38;
            local_70 = local_88;
            JVar9.u.float64 = JVar6.float64;
            local_68 = JVar8;
            JVar9 = js_object_getOwnPropertyDescriptor(ctx,JVar9,(int)uVar4,(JSValue *)&local_78,0);
            local_48 = JVar3;
            if (0xfffffff4 < (uint)JVar8.tag) {
              uVar1 = *JVar3.ptr;
              uVar4 = (ulong)uVar1;
              *(uint *)JVar3.ptr = uVar1 - 1;
              if ((int)uVar1 < 2) {
                __JS_FreeValueRT(ctx->rt,JVar8);
              }
            }
            if ((int)JVar9.tag != 3) {
              if ((int)JVar9.tag != 6) {
                uVar4 = (ulong)local_50[uVar7].atom;
                this_obj.u.ptr = local_90.ptr;
                iVar2 = JS_DefinePropertyValue(ctx,this_obj,local_50[uVar7].atom,JVar9,0x4007);
                if (-1 < iVar2) goto LAB_0016347b;
              }
              goto LAB_001634ec;
            }
LAB_0016347b:
            uVar7 = uVar7 + 1;
          } while (local_58 != uVar7);
        }
        js_free_prop_enum(ctx,local_80,(uint32_t)local_58);
        local_78.float64 = local_98.float64;
        if ((0xfffffff4 < (uint)local_88) &&
           (iVar2 = *local_98.ptr, *(int *)local_98.ptr = iVar2 + -1, iVar2 < 2)) {
          v.tag = local_88;
          v.u.ptr = local_98.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        uVar4 = (ulong)local_90.ptr & 0xffffffff00000000;
        uVar7 = (ulong)local_90.ptr & 0xffffffff;
        goto LAB_00163581;
      }
    }
    else {
      JVar8 = (JSValue)(ZEXT816(3) << 0x40);
      uVar7 = 0;
    }
LAB_001634fb:
    js_free_prop_enum(ctx,local_80,local_9c);
    local_78.float64 = local_98.float64;
    if ((0xfffffff4 < (uint)iVar5) &&
       (iVar2 = *local_98.ptr, *(int *)local_98.ptr = iVar2 + -1, iVar2 < 2)) {
      v_00.tag = iVar5;
      v_00.u.ptr = local_98.ptr;
      __JS_FreeValueRT(ctx->rt,v_00);
    }
    local_78.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar7 << 0x20);
    if ((0xfffffff4 < (uint)JVar8.tag) &&
       (iVar2 = *local_78.ptr, *(int *)local_78.ptr = iVar2 + -1, iVar2 < 2)) {
      v_01.tag = JVar8.tag;
      v_01.u.ptr = local_78.ptr;
      __JS_FreeValueRT(ctx->rt,v_01);
    }
    uVar7 = 0;
    uVar4 = 0;
    this_obj.tag = 6;
  }
LAB_00163581:
  JVar10.u.ptr = (void *)(uVar7 | uVar4);
  JVar10.tag = this_obj.tag;
  return JVar10;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptors(JSContext *ctx, JSValueConst this_val,
                                                   int argc, JSValueConst *argv)
{
    //getOwnPropertyDescriptors(obj)
    JSValue obj, r;
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;

    r = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p,
                               JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK))
        goto exception;
    r = JS_NewObject(ctx);
    if (JS_IsException(r))
        goto exception;
    for(i = 0; i < len; i++) {
        JSValue atomValue, desc;
        JSValueConst args[2];

        atomValue = JS_AtomToValue(ctx, props[i].atom);
        if (JS_IsException(atomValue))
            goto exception;
        args[0] = obj;
        args[1] = atomValue;
        desc = js_object_getOwnPropertyDescriptor(ctx, JS_UNDEFINED, 2, args, 0);
        JS_FreeValue(ctx, atomValue);
        if (JS_IsException(desc))
            goto exception;
        if (!JS_IsUndefined(desc)) {
            if (JS_DefinePropertyValue(ctx, r, props[i].atom, desc,
                                       JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    return r;

exception:
    js_free_prop_enum(ctx, props, len);
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, r);
    return JS_EXCEPTION;
}